

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O0

factor * __thiscall
merlin::factor::binaryOp<merlin::factor::binOpPower>
          (factor *B,factor *__return_storage_ptr__,factor *this)

{
  value B_local;
  factor *this_local;
  factor *F;
  
  factor(__return_storage_ptr__,this);
  binaryOpIP<merlin::factor::binOpPower>(B,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

factor binaryOp(const value B,
			Function Op) const {
		factor F = *this;
		F.binaryOpIP(B, Op);
		return F; // for scalar args, define with an in-place operator
	}